

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_peaks.cpp
# Opt level: O1

void trt_pose::parse::find_peaks_out_hw
               (int *counts,int *peaks,float *input,int H,int W,int M,float threshold,
               int window_size)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  float *pfVar18;
  ulong uVar19;
  
  iVar14 = 0;
  if (0 < M && 0 < H) {
    iVar4 = window_size / 2;
    uVar6 = (ulong)(uint)W;
    uVar19 = 0;
    iVar14 = 0;
    uVar3 = -iVar4;
    do {
      uVar7 = 0;
      if (0 < (int)uVar3) {
        uVar7 = (ulong)uVar3;
      }
      if (0 < W) {
        iVar17 = (int)uVar19;
        iVar5 = iVar17 - iVar4;
        if (iVar17 - iVar4 < 1) {
          iVar5 = 0;
        }
        iVar13 = iVar4 + 1 + iVar17;
        if (H <= iVar13) {
          iVar13 = H;
        }
        lVar15 = 0;
        uVar9 = -iVar4;
        do {
          uVar8 = 0;
          if (0 < (int)uVar9) {
            uVar8 = (ulong)uVar9;
          }
          if (threshold <= input[uVar19 * uVar6 + lVar15]) {
            iVar1 = (int)lVar15;
            iVar16 = iVar4 + 1 + iVar1;
            if (W <= iVar16) {
              iVar16 = W;
            }
            if (iVar5 < iVar13) {
              iVar10 = iVar1 - iVar4;
              if (iVar1 - iVar4 < 1) {
                iVar10 = 0;
              }
              bVar2 = true;
              uVar12 = uVar7;
              pfVar18 = (float *)(uVar6 * 4 * uVar7 + (long)input);
              do {
                uVar11 = uVar8;
                if (iVar10 < iVar16) {
                  do {
                    if (input[uVar19 * uVar6 + lVar15] < pfVar18[uVar11]) {
                      bVar2 = false;
                    }
                    uVar11 = uVar11 + 1;
                  } while ((long)uVar11 < (long)iVar16);
                }
                uVar12 = uVar12 + 1;
                pfVar18 = pfVar18 + uVar6;
              } while ((long)uVar12 < (long)iVar13);
              if (!bVar2) goto LAB_00102644;
            }
            peaks[iVar14 * 2] = iVar17;
            peaks[iVar14 * 2 + 1] = iVar1;
            iVar14 = iVar14 + 1;
          }
LAB_00102644:
          lVar15 = lVar15 + 1;
        } while ((lVar15 < W) && (uVar9 = uVar9 + 1, iVar14 < M));
      }
      uVar19 = uVar19 + 1;
    } while ((uVar19 < (uint)H) && (uVar3 = uVar3 + 1, iVar14 < M));
  }
  *counts = iVar14;
  return;
}

Assistant:

void find_peaks_out_hw(int *counts,        // 1
                       int *peaks,         // Mx2
                       const float *input, // HxW
                       const int H, const int W, const int M,
                       const float threshold, const int window_size) {
  int win = window_size / 2;
  int count = 0;

  for (int i = 0; i < H && count < M; i++) {
    for (int j = 0; j < W && count < M; j++) {
      float val = input[i * W + j];

      // skip if below threshold
      if (val < threshold)
        continue;

      // compute window bounds
      int ii_min = MAX(i - win, 0);
      int jj_min = MAX(j - win, 0);
      int ii_max = MIN(i + win + 1, H);
      int jj_max = MIN(j + win + 1, W);

      // search for larger value in window
      bool is_peak = true;
      for (int ii = ii_min; ii < ii_max; ii++) {
        for (int jj = jj_min; jj < jj_max; jj++) {
          if (input[ii * W + jj] > val) {
            is_peak = false;
          }
        }
      }

      // add peak
      if (is_peak) {
        peaks[count * 2] = i;
        peaks[count * 2 + 1] = j;
        count++;
      }
    }
  }

  *counts = count;
}